

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O3

ON_wString __thiscall
ON_wString::FromYearDayHourMinuteSecond
          (ON_wString *this,int year,int day_of_year,int hour,int minute,int second,
          ON_DateFormat date_format,ON_TimeFormat time_format,wchar_t date_separator,
          wchar_t date_time_separator,wchar_t time_separator)

{
  uint mday;
  uint month;
  
  mday = 0;
  _mday = 0;
  if ((day_of_year - 1U < 0x16e) && (0 < year)) {
    month = 0;
    mday = 0;
    if (Omit < date_format) {
      ON_GetGregorianMonthAndDayOfMonth(year,day_of_year,&month,&mday);
    }
  }
  else {
    month = 0;
  }
  FromYearMonthDayHourMinuteSecond
            (this,year,month,mday,hour,minute,second,date_format,time_format,date_separator,
             date_time_separator,time_separator);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::FromYearDayHourMinuteSecond(
  int year,
  int day_of_year,
  int hour,
  int minute,
  int second,
  ON_DateFormat date_format,
  ON_TimeFormat time_format,
  wchar_t date_separator,
  wchar_t date_time_separator,
  wchar_t time_separator
)
{
  unsigned int month = 0;
  unsigned int mday = 0;
  if ( ON_DateFormat::Unset != date_format && ON_DateFormat::Omit != date_format && year > 0 && day_of_year > 0 && day_of_year <= 366 )
  {
    ON_GetGregorianMonthAndDayOfMonth(
      (unsigned int)year,
      (unsigned int)day_of_year,
      &month,
      &mday
    );
  }

  return ON_wString::FromYearMonthDayHourMinuteSecond(
    year,
    (int)month,
    (int)mday,
    hour,
    minute,
    second,
    date_format,
    time_format,
    date_separator,
    date_time_separator,
    time_separator
  );
}